

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O3

xmlSchematronTestPtr_conflict
xmlSchematronAddTest
          (xmlSchematronParserCtxtPtr ctxt,xmlSchematronTestType type,
          xmlSchematronRulePtr_conflict rule,xmlNodePtr node,xmlChar *test,xmlChar *report)

{
  xmlSchematronTestPtr pxVar1;
  xmlXPathCompExprPtr pxVar2;
  xmlSchematronTestPtr_conflict pxVar3;
  xmlSchematronTestPtr_conflict pxVar4;
  xmlChar *str2;
  
  str2 = report;
  pxVar2 = xmlXPathCtxtCompile(ctxt->xctxt,test);
  if (pxVar2 == (xmlXPathCompExprPtr)0x0) {
    xmlSchematronPErr(ctxt,node,0x6df,"Failed to compile test expression %s",test,str2);
    pxVar3 = (xmlSchematronTestPtr_conflict)0x0;
  }
  else {
    pxVar3 = (xmlSchematronTestPtr_conflict)(*xmlMalloc)(0x30);
    if (pxVar3 == (xmlSchematronTestPtr_conflict)0x0) {
      ctxt->nberrors = ctxt->nberrors + 1;
      pxVar3 = (xmlSchematronTestPtr_conflict)0x0;
      xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x10,
                          (xmlError *)0x0);
    }
    else {
      pxVar3->next = (xmlSchematronTestPtr)0x0;
      *(undefined8 *)&pxVar3->type = 0;
      pxVar3->type = type;
      pxVar3->node = node;
      pxVar3->test = test;
      pxVar3->comp = pxVar2;
      pxVar3->report = report;
      pxVar1 = rule->tests;
      if (rule->tests == (xmlSchematronTestPtr_conflict)0x0) {
        rule->tests = pxVar3;
      }
      else {
        do {
          pxVar4 = pxVar1;
          pxVar1 = pxVar4->next;
        } while (pxVar1 != (xmlSchematronTestPtr)0x0);
        pxVar4->next = pxVar3;
      }
    }
  }
  return pxVar3;
}

Assistant:

static xmlSchematronTestPtr
xmlSchematronAddTest(xmlSchematronParserCtxtPtr ctxt,
                     xmlSchematronTestType type,
                     xmlSchematronRulePtr rule,
                     xmlNodePtr node, xmlChar *test, xmlChar *report)
{
    xmlSchematronTestPtr ret;
    xmlXPathCompExprPtr comp;

    if ((ctxt == NULL) || (rule == NULL) || (node == NULL) ||
        (test == NULL))
        return(NULL);

    /*
     * try first to compile the test expression
     */
    comp = xmlXPathCtxtCompile(ctxt->xctxt, test);
    if (comp == NULL) {
        xmlSchematronPErr(ctxt, node,
            XML_SCHEMAP_NOROOT,
            "Failed to compile test expression %s",
            test, NULL);
        return(NULL);
    }

    ret = (xmlSchematronTestPtr) xmlMalloc(sizeof(xmlSchematronTest));
    if (ret == NULL) {
        xmlSchematronPErrMemory(ctxt);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchematronTest));
    ret->type = type;
    ret->node = node;
    ret->test = test;
    ret->comp = comp;
    ret->report = report;
    ret->next = NULL;
    if (rule->tests == NULL) {
        rule->tests = ret;
    } else {
        xmlSchematronTestPtr prev = rule->tests;

        while (prev->next != NULL)
             prev = prev->next;
        prev->next = ret;
    }
    return (ret);
}